

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_type_enum_value_pos(lysp_yang_ctx *ctx,ly_stmt val_kw,lysp_type_enum *enm)

{
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  ly_ctx *local_138;
  ly_ctx *local_128;
  ly_ctx *local_108;
  ly_ctx *local_e8;
  ly_ctx *local_c8;
  ly_ctx *local_a8;
  ly_ctx *local_88;
  ly_ctx *local_78;
  bool local_69;
  ly_stmt lStack_64;
  ly_bool __loop_end;
  LY_ERR ret__;
  ly_stmt kw;
  unsigned_long_long unum;
  longlong num;
  size_t word_len;
  char *ptr;
  char *word;
  char *buf;
  lysp_type_enum *plStack_28;
  LY_ERR ret;
  lysp_type_enum *enm_local;
  lysp_yang_ctx *plStack_18;
  ly_stmt val_kw_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  word = (char *)0x0;
  unum = 0;
  _ret__ = 0;
  plStack_28 = enm;
  enm_local._4_4_ = val_kw;
  plStack_18 = ctx;
  if ((enm->flags & 0x200) == 0) {
    enm->flags = enm->flags | 0x200;
    LVar1 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&ptr,&word,(size_t *)&num);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if ((((num == 0) || (*ptr == '+')) || ((*ptr == '0' && (1 < (ulong)num)))) ||
       ((enm_local._4_4_ == LY_STMT_POSITION && (iVar2 = strncmp(ptr,"-0",2), iVar2 == 0)))) {
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_88 = (ly_ctx *)0x0;
      }
      else {
        local_88 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      pcVar3 = lyplg_ext_stmt2str(enm_local._4_4_);
      ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
              num & 0xffffffff,ptr,pcVar3);
      buf._4_4_ = LY_EVALID;
    }
    else {
      piVar4 = __errno_location();
      *piVar4 = 0;
      if (enm_local._4_4_ == LY_STMT_VALUE) {
        unum = strtoll(ptr,(char **)&word_len,10);
        if (((long)unum < -0x80000000) || (0x7fffffff < (long)unum)) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_a8 = (ly_ctx *)0x0;
          }
          else {
            local_a8 = (ly_ctx *)
                       **(undefined8 **)
                         (plStack_18->parsed_mods->field_2).dnodes
                         [plStack_18->parsed_mods->count - 1];
          }
          pcVar3 = lyplg_ext_stmt2str(enm_local._4_4_);
          ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                  num & 0xffffffff,ptr,pcVar3);
          buf._4_4_ = LY_EVALID;
          goto LAB_001befb9;
        }
      }
      else {
        _ret__ = strtoull(ptr,(char **)&word_len,10);
        if (0xffffffff < _ret__) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_c8 = (ly_ctx *)0x0;
          }
          else {
            local_c8 = (ly_ctx *)
                       **(undefined8 **)
                         (plStack_18->parsed_mods->field_2).dnodes
                         [plStack_18->parsed_mods->count - 1];
          }
          pcVar3 = lyplg_ext_stmt2str(enm_local._4_4_);
          ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                  num & 0xffffffff,ptr,pcVar3);
          buf._4_4_ = LY_EVALID;
          goto LAB_001befb9;
        }
      }
      if (word_len - (long)ptr == num) {
        piVar4 = __errno_location();
        if (*piVar4 == 0x22) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_108 = (ly_ctx *)0x0;
          }
          else {
            local_108 = (ly_ctx *)
                        **(undefined8 **)
                          (plStack_18->parsed_mods->field_2).dnodes
                          [plStack_18->parsed_mods->count - 1];
          }
          pcVar3 = lyplg_ext_stmt2str(enm_local._4_4_);
          ly_vlog(local_108,(char *)0x0,LYVE_SYNTAX_YANG,"Value \"%.*s\" is out of \"%s\" bounds.",
                  num & 0xffffffff,ptr,pcVar3);
          buf._4_4_ = LY_EVALID;
        }
        else {
          if (enm_local._4_4_ == LY_STMT_VALUE) {
            plStack_28->value = unum;
          }
          else {
            plStack_28->value = _ret__;
          }
          buf._4_4_ = get_keyword(plStack_18,&stack0xffffffffffffff9c,&ptr,(size_t *)&num);
          if (buf._4_4_ == LY_SUCCESS) {
            if (lStack_64 == LY_STMT_SYNTAX_SEMICOLON) {
              local_69 = true;
            }
            else {
              if (lStack_64 != LY_STMT_SYNTAX_LEFT_BRACE) {
                if (plStack_18 == (lysp_yang_ctx *)0x0) {
                  local_128 = (ly_ctx *)0x0;
                }
                else {
                  local_128 = (ly_ctx *)
                              **(undefined8 **)
                                (plStack_18->parsed_mods->field_2).dnodes
                                [plStack_18->parsed_mods->count - 1];
                }
                pcVar3 = lyplg_ext_stmt2str(lStack_64);
                ly_vlog(local_128,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
                buf._4_4_ = LY_EVALID;
                goto LAB_001befb9;
              }
              buf._4_4_ = get_keyword(plStack_18,&stack0xffffffffffffff9c,&ptr,(size_t *)&num);
              if (buf._4_4_ != LY_SUCCESS) goto LAB_001befb9;
              local_69 = lStack_64 == LY_STMT_SYNTAX_RIGHT_BRACE;
            }
            while (!local_69) {
              if (lStack_64 != LY_STMT_EXTENSION_INSTANCE) {
                if (plStack_18 == (lysp_yang_ctx *)0x0) {
                  local_138 = (ly_ctx *)0x0;
                }
                else {
                  local_138 = (ly_ctx *)
                              **(undefined8 **)
                                (plStack_18->parsed_mods->field_2).dnodes
                                [plStack_18->parsed_mods->count - 1];
                }
                pcVar3 = lyplg_ext_stmt2str(lStack_64);
                pcVar5 = lyplg_ext_stmt2str(enm_local._4_4_);
                ly_vlog(local_138,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,pcVar5);
                buf._4_4_ = LY_EVALID;
                break;
              }
              buf._4_4_ = parse_ext(plStack_18,ptr,num,plStack_28,enm_local._4_4_,0,
                                    &plStack_28->exts);
              if ((buf._4_4_ != LY_SUCCESS) ||
                 (buf._4_4_ = get_keyword(plStack_18,&stack0xffffffffffffff9c,&ptr,(size_t *)&num),
                 buf._4_4_ != LY_SUCCESS)) break;
              if (lStack_64 == LY_STMT_SYNTAX_RIGHT_BRACE) {
                local_69 = true;
              }
            }
          }
        }
      }
      else {
        if (plStack_18 == (lysp_yang_ctx *)0x0) {
          local_e8 = (ly_ctx *)0x0;
        }
        else {
          local_e8 = (ly_ctx *)
                     **(undefined8 **)
                       (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1]
          ;
        }
        pcVar3 = lyplg_ext_stmt2str(enm_local._4_4_);
        ly_vlog(local_e8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                num & 0xffffffff,ptr,pcVar3);
        buf._4_4_ = LY_EVALID;
      }
    }
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_78 = (ly_ctx *)0x0;
    }
    else {
      local_78 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar3 = lyplg_ext_stmt2str(val_kw);
    ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar3);
    buf._4_4_ = LY_EVALID;
  }
LAB_001befb9:
  free(word);
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_type_enum_value_pos(struct lysp_yang_ctx *ctx, enum ly_stmt val_kw, struct lysp_type_enum *enm)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    long long num = 0;
    unsigned long long unum = 0;
    enum ly_stmt kw;

    if (enm->flags & LYS_SET_VALUE) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }
    enm->flags |= LYS_SET_VALUE;

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if (!word_len || (word[0] == '+') || ((word[0] == '0') && (word_len > 1)) || ((val_kw == LY_STMT_POSITION) && !strncmp(word, "-0", 2))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    errno = 0;
    if (val_kw == LY_STMT_VALUE) {
        num = strtoll(word, &ptr, LY_BASE_DEC);
        if ((num < INT64_C(-2147483648)) || (num > INT64_C(2147483647))) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
            ret = LY_EVALID;
            goto cleanup;
        }
    } else {
        unum = strtoull(word, &ptr, LY_BASE_DEC);
        if (unum > UINT64_C(4294967295)) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
            ret = LY_EVALID;
            goto cleanup;
        }
    }
    /* we have not parsed the whole argument */
    if ((size_t)(ptr - word) != word_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }
    if (errno == ERANGE) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }
    if (val_kw == LY_STMT_VALUE) {
        enm->value = num;
    } else {
        enm->value = unum;
    }

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            ret = parse_ext(ctx, word, word_len, enm, val_kw, 0, &enm->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(val_kw));
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}